

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O2

void vkt::texture::anon_unknown_1::populateTextureCompressedFormatTests
               (TestCaseGroup *compressedTextureTests)

{
  FilterMode FVar1;
  undefined8 *puVar2;
  TestNode *node;
  Enum<vk::VkFormat,_4UL> *in_RDX;
  Enum<vk::VkFormat,_4UL> *extraout_RDX;
  long lVar3;
  allocator<char> local_172;
  allocator<char> local_171;
  long local_170;
  TestNode *local_168;
  TestContext *local_160;
  undefined8 *local_158;
  string local_150;
  code *local_130;
  undefined8 local_128;
  FilterMode local_118;
  _Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> local_110;
  undefined8 local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string nameBase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string formatStr;
  
  local_160 = (compressedTextureTests->super_TestNode).m_testCtx;
  local_170 = 0;
  local_168 = &compressedTextureTests->super_TestNode;
  for (; local_170 != 2; local_170 = local_170 + 1) {
    local_158 = &DAT_00c0c9a0 + local_170 * 2;
    for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 4) {
      FVar1 = *(FilterMode *)((long)&DAT_009f2450 + lVar3);
      local_130 = ::vk::getFormatName;
      local_128._0_4_ = FVar1;
      de::toString<tcu::Format::Enum<vk::VkFormat,4ul>>(&formatStr,(de *)&local_130,in_RDX);
      std::__cxx11::string::substr((ulong)&local_130,(ulong)&formatStr);
      de::toLower(&nameBase,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                ((Texture2DTestCaseParameters *)&local_130);
      puVar2 = local_158;
      local_f8 = *local_158;
      local_128._0_4_ = NEAREST;
      local_128._4_4_ = NEAREST;
      local_150._M_dataplus._M_p._0_4_ = 0;
      local_118 = FVar1;
      std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
      emplace_back<vkt::texture::util::Program>
                ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  *)&local_110,(Program *)&local_150);
      node = (TestNode *)operator_new(0xb0);
      std::operator+(&local_90,&nameBase,"_2d_");
      std::operator+(&local_d0,&local_90,(char *)puVar2[1]);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,local_d0._M_dataplus._M_p,&local_171);
      std::operator+(&local_f0,&formatStr,", TEXTURETYPE_2D");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,local_f0._M_dataplus._M_p,&local_172);
      TestCase::TestCase((TestCase *)node,local_160,&local_150,&local_70);
      node->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00c0c9d0;
      util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                ((Texture2DTestCaseParameters *)(node + 1),(Texture2DTestCaseParameters *)&local_130
                );
      tcu::TestNode::addChild(local_168,node);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::_Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
      ~_Vector_base(&local_110);
      std::__cxx11::string::~string((string *)&nameBase);
      std::__cxx11::string::~string((string *)&formatStr);
      in_RDX = extraout_RDX;
    }
  }
  return;
}

Assistant:

void populateTextureCompressedFormatTests (tcu::TestCaseGroup* compressedTextureTests)
{
	tcu::TestContext&	testCtx	= compressedTextureTests->getTestContext();

	// ETC2 and EAC compressed formats.
	const struct {
		const VkFormat	format;
	} etc2Formats[] =
	{
		{ VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK	},

		{ VK_FORMAT_EAC_R11_UNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11_SNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11G11_UNORM_BLOCK		},
		{ VK_FORMAT_EAC_R11G11_SNORM_BLOCK		},
	};

	const struct {
		const int	width;
		const int	height;
		const char*	name;
	} sizes[] =
	{
		{ 128, 64, "pot"  },
		{ 51,  65, "npot" },
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
	{
		const string	formatStr	= de::toString(getFormatStr(etc2Formats[formatNdx].format));
		const string	nameBase	= de::toLower(formatStr.substr(10));

		Compressed2DTestParameters	testParameters;
		testParameters.format		= etc2Formats[formatNdx].format;
		testParameters.width		= sizes[sizeNdx].width;
		testParameters.height		= sizes[sizeNdx].height;
		testParameters.minFilter	= tcu::Sampler::NEAREST;
		testParameters.magFilter	= tcu::Sampler::NEAREST;
		testParameters.programs.push_back(PROGRAM_2D_FLOAT);

		compressedTextureTests->addChild(new TextureTestCase<Compressed2DTestInstance>(testCtx, (nameBase + "_2d_" + sizes[sizeNdx].name).c_str(), (formatStr + ", TEXTURETYPE_2D").c_str(), testParameters));
	}
}